

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O1

void __thiscall indigox::Molecule::RemoveBond(Molecule *this,Bond_p *b)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
  __position;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
  pVar2;
  Bond_p hit;
  key_type local_60;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  Bond::GetMolecule((Bond *)&local_60);
  std::__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<indigox::Molecule,void>
            ((__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0,
             (__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<indigox::Molecule>);
  _Var1._M_pi = local_50._M_pi;
  if (local_48 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if ((element_type *)
      local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)_Var1._M_pi) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<indigox::Bond>*,std::vector<std::shared_ptr<indigox::Bond>,std::allocator<std::shared_ptr<indigox::Bond>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<indigox::Bond>const>>
                           ((this->bonds_).
                            super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->bonds_).
                            super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,b);
    if (__position._M_current !=
        (this->bonds_).
        super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((__position._M_current)->super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((__position._M_current)->super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if ((element_type *)
          local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                    &((element_type *)
                     local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>)->
                   _M_weak_this).super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                           &((element_type *)
                            local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>)->
                          _M_weak_this).super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                    &((element_type *)
                     local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>)->
                   _M_weak_this).super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                           &((element_type *)
                            local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>)->
                          _M_weak_this).super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 1;
        }
      }
      Bond::GetSourceAtom((Bond *)&stack0xffffffffffffffb0);
      local_30._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_28._M_pi =
           local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((element_type *)
          local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                    &(local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                   super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                         &(local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                        super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                    &(local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                   super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                         &(local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                        super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      Atom::RemoveBond((Atom *)local_50._M_pi,(Bond_p *)&stack0xffffffffffffffd0);
      if ((element_type *)local_28._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
      }
      if (local_48 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
      }
      Bond::GetTargetAtom((Bond *)&stack0xffffffffffffffb0);
      local_40._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_38._M_pi =
           local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((element_type *)
          local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                    &(local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                   super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                         &(local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                        super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                    &(local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                   super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<indigox::Atom> *)
                         &(local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                        super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      Atom::RemoveBond((Atom *)local_50._M_pi,(Bond_p *)&stack0xffffffffffffffc0);
      if ((element_type *)local_38._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      if (local_48 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
      }
      std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
      ::_M_erase(&this->bonds_,(iterator)__position._M_current);
      pVar2 = std::
              _Rb_tree<std::shared_ptr<indigox::Bond>,_std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
              ::equal_range(&(this->bond_to_edge_)._M_t,&local_60);
      std::
      _Rb_tree<std::shared_ptr<indigox::Bond>,_std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
      ::_M_erase_aux(&(this->bond_to_edge_)._M_t,(_Base_ptr)pVar2.first._M_node,
                     (_Base_ptr)pVar2.second._M_node);
      Bond::Clear(local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      this->modified_ = true;
      if ((element_type *)
          local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
  }
  return;
}

Assistant:

void Molecule::RemoveBond(Bond_p b) {
  if (b->GetMolecule() != shared_from_this()) return;
  auto it = std::find(bonds_.begin(), bonds_.end(), b);
  if (it != bonds_.end()) {
    Bond_p hit = *it;
    hit->GetSourceAtom()->RemoveBond(hit);
    hit->GetTargetAtom()->RemoveBond(hit);
    bonds_.erase(it);
    bond_to_edge_.erase(hit);
    hit->Clear();
    modified_ = true;
  }
}